

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O2

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getStencilStateSetName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          VkStencilOpState *stencilOpStateFront,VkStencilOpState *stencilOpStateBack)

{
  ostream *poVar1;
  VkStencilOpState *stencilOpState;
  VkStencilOpState *stencilOpState_00;
  ostringstream name;
  string sStack_1d8;
  string local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"front_");
  getStencilName_abi_cxx11_(&local_1b8,this,stencilOpState);
  poVar1 = std::operator<<(poVar1,(string *)&local_1b8);
  poVar1 = std::operator<<(poVar1,"_back_");
  getStencilName_abi_cxx11_
            (&sStack_1d8,(_anonymous_namespace_ *)stencilOpStateFront,stencilOpState_00);
  std::operator<<(poVar1,(string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string getStencilStateSetName(const VkStencilOpState& stencilOpStateFront,
								   const VkStencilOpState& stencilOpStateBack)
{
	std::ostringstream name;

	name << "front_" << getStencilName(stencilOpStateFront)
		 << "_back_" << getStencilName(stencilOpStateBack);

	return name.str();
}